

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.hpp
# Opt level: O2

arg_type_mismatch * __thiscall
boost::runtime::specific_param_error<boost::runtime::arg_type_mismatch,_boost::runtime::init_error>
::operator<<(arg_type_mismatch *__return_storage_ptr__,
            specific_param_error<boost::runtime::arg_type_mismatch,_boost::runtime::init_error>
            *this,char *val)

{
  std::__cxx11::string::append((char *)&(this->super_init_error).super_param_error.msg);
  arg_type_mismatch::arg_type_mismatch(__return_storage_ptr__,(arg_type_mismatch *)this);
  return __return_storage_ptr__;
}

Assistant:

Derived operator<<(char const* val) &&
    {
        this->msg.append( val );

        return reinterpret_cast<Derived&&>(*this);
    }